

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_audit.cpp
# Opt level: O0

bool compare_defaults(t_const_value *newStructDefault,t_const_value *oldStructDefault)

{
  size_t *this;
  t_const_value_type tVar1;
  t_const_value_type tVar2;
  int64_t iVar3;
  int64_t iVar4;
  vector<t_const_value_*,_std::allocator<t_const_value_*>_> *this_00;
  vector<t_const_value_*,_std::allocator<t_const_value_*>_> *this_01;
  size_type sVar5;
  size_type sVar6;
  const_iterator __first1;
  const_iterator __last1;
  const_iterator __first2;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  *pmVar7;
  size_type sVar8;
  size_type sVar9;
  double dVar10;
  double dVar11;
  bool local_199;
  bool local_181;
  string local_160;
  string local_140;
  _Base_ptr local_120;
  _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_> local_118;
  _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_> local_110;
  undefined1 local_101;
  undefined1 local_100 [7];
  bool defaultValuesCompare_1;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  oldMap;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  newMap;
  bool defaultValuesCompare;
  vector<t_const_value_*,_std::allocator<t_const_value_*>_> *newDefaultList;
  vector<t_const_value_*,_std::allocator<t_const_value_*>_> *oldDefaultList;
  string local_60;
  string local_40;
  t_const_value *local_20;
  t_const_value *oldStructDefault_local;
  t_const_value *newStructDefault_local;
  
  if ((newStructDefault == (t_const_value *)0x0) && (oldStructDefault == (t_const_value *)0x0)) {
    newStructDefault_local._7_1_ = 1;
  }
  else if ((newStructDefault == (t_const_value *)0x0) && (oldStructDefault != (t_const_value *)0x0))
  {
    newStructDefault_local._7_1_ = 0;
  }
  else if ((newStructDefault == (t_const_value *)0x0) || (oldStructDefault != (t_const_value *)0x0))
  {
    local_20 = oldStructDefault;
    oldStructDefault_local = newStructDefault;
    tVar1 = t_const_value::get_type(newStructDefault);
    tVar2 = t_const_value::get_type(local_20);
    if (tVar1 == tVar2) {
      tVar1 = t_const_value::get_type(oldStructDefault_local);
      switch(tVar1) {
      case CV_INTEGER:
        iVar3 = t_const_value::get_integer(oldStructDefault_local);
        iVar4 = t_const_value::get_integer(local_20);
        newStructDefault_local._7_1_ = iVar3 == iVar4;
        break;
      case CV_DOUBLE:
        dVar10 = t_const_value::get_double(oldStructDefault_local);
        dVar11 = t_const_value::get_double(local_20);
        newStructDefault_local._7_1_ = dVar10 == dVar11;
        break;
      case CV_STRING:
        t_const_value::get_string_abi_cxx11_(&local_40,oldStructDefault_local);
        t_const_value::get_string_abi_cxx11_(&local_60,local_20);
        newStructDefault_local._7_1_ = std::operator==(&local_40,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_40);
        break;
      case CV_MAP:
        pmVar7 = t_const_value::get_map(oldStructDefault_local);
        std::
        map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
        ::map((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
               *)&oldMap._M_t._M_impl.super__Rb_tree_header._M_node_count,pmVar7);
        pmVar7 = t_const_value::get_map(local_20);
        std::
        map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
        ::map((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
               *)local_100,pmVar7);
        sVar8 = std::
                map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                ::size((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                        *)local_100);
        sVar9 = std::
                map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                ::size((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                        *)&oldMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
        local_101 = sVar8 == sVar9;
        local_199 = false;
        if ((bool)local_101) {
          this = &oldMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
          local_110._M_node =
               (_Base_ptr)
               std::
               map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
               ::begin((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                        *)this);
          local_118._M_node =
               (_Base_ptr)
               std::
               map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
               ::end((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                      *)this);
          local_120 = (_Base_ptr)
                      std::
                      map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                      ::begin((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                               *)local_100);
          local_199 = std::
                      equal<std::_Rb_tree_const_iterator<std::pair<t_const_value*const,t_const_value*>>,std::_Rb_tree_const_iterator<std::pair<t_const_value*const,t_const_value*>>,bool(*)(std::pair<t_const_value*,t_const_value*>,std::pair<t_const_value*,t_const_value*>)>
                                (local_110,local_118,
                                 (_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                                  )local_120,compare_pair);
        }
        newStructDefault_local._7_1_ = local_199;
        std::
        map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
        ::~map((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                *)local_100);
        std::
        map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
        ::~map((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                *)&oldMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
        break;
      case CV_LIST:
        this_00 = t_const_value::get_list(local_20);
        this_01 = t_const_value::get_list(oldStructDefault_local);
        sVar5 = std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::size(this_00);
        sVar6 = std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::size(this_01);
        local_181 = false;
        if (sVar5 == sVar6) {
          __first1 = std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::begin(this_01);
          __last1 = std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::end(this_01);
          __first2 = std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::begin(this_00);
          local_181 = std::
                      equal<__gnu_cxx::__normal_iterator<t_const_value*const*,std::vector<t_const_value*,std::allocator<t_const_value*>>>,__gnu_cxx::__normal_iterator<t_const_value*const*,std::vector<t_const_value*,std::allocator<t_const_value*>>>,bool(*)(t_const_value*,t_const_value*)>
                                ((__normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                                  )__first1._M_current,
                                 (__normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                                  )__last1._M_current,
                                 (__normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                                  )__first2._M_current,compare_defaults);
        }
        newStructDefault_local._7_1_ = local_181;
        break;
      case CV_IDENTIFIER:
        t_const_value::get_identifier_abi_cxx11_(&local_140,oldStructDefault_local);
        t_const_value::get_identifier_abi_cxx11_(&local_160,local_20);
        newStructDefault_local._7_1_ = std::operator==(&local_140,&local_160);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_140);
        break;
      default:
        newStructDefault_local._7_1_ = 0;
      }
    }
    else {
      newStructDefault_local._7_1_ = 0;
    }
  }
  else {
    newStructDefault_local._7_1_ = 0;
  }
  return (bool)(newStructDefault_local._7_1_ & 1);
}

Assistant:

bool compare_defaults(t_const_value* newStructDefault, t_const_value* oldStructDefault)
{
   if(newStructDefault == nullptr && oldStructDefault == nullptr) return true;
   else if(newStructDefault == nullptr && oldStructDefault != nullptr) return false;
   else if (newStructDefault != nullptr && oldStructDefault == nullptr) return false;

   if(newStructDefault->get_type() != oldStructDefault->get_type())
   {
      return false;
   }

   switch(newStructDefault->get_type())
   {
      case t_const_value::CV_INTEGER:
         return (newStructDefault->get_integer() == oldStructDefault->get_integer());
      case t_const_value::CV_DOUBLE:
         return (newStructDefault->get_double() == oldStructDefault->get_double());
      case t_const_value::CV_STRING:
         return (newStructDefault->get_string() == oldStructDefault->get_string());
      case t_const_value::CV_LIST:
         {
            const std::vector<t_const_value*>& oldDefaultList = oldStructDefault->get_list();
            const std::vector<t_const_value*>& newDefaultList = newStructDefault->get_list();
            bool defaultValuesCompare = (oldDefaultList.size() == newDefaultList.size());

            return defaultValuesCompare && std::equal(newDefaultList.begin(), newDefaultList.end(), oldDefaultList.begin(), compare_defaults);
         }
      case t_const_value::CV_MAP:
         {
            const std::map<t_const_value*, t_const_value*, t_const_value::value_compare> newMap = newStructDefault->get_map();
            const std::map<t_const_value*, t_const_value*, t_const_value::value_compare> oldMap = oldStructDefault->get_map();

            bool defaultValuesCompare = (oldMap.size() == newMap.size());

            return defaultValuesCompare && std::equal(newMap.begin(), newMap.end(), oldMap.begin(), compare_pair);
         }
      case t_const_value::CV_IDENTIFIER:
         return (newStructDefault->get_identifier() == oldStructDefault->get_identifier());
      default:
         return false;
   }

}